

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

uchar * stbi_write_png_to_mem(uchar *pixels,int stride_bytes,int x,int y,int n,int *out_len)

{
  int iVar1;
  int *piVar2;
  uchar *puVar3;
  uchar uVar4;
  int iVar5;
  uchar *puVar6;
  char *line_buffer;
  uchar *__src;
  ulong uVar7;
  int filter_type;
  size_t __n;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  int iVar11;
  int data_len;
  int y_00;
  ulong uVar12;
  int filter_type_00;
  int zlen;
  ulong local_68;
  int *local_60;
  uchar *local_58;
  long local_50;
  size_t local_48;
  ulong local_40;
  uchar *local_38;
  
  iVar1 = stbi_write_force_png_filter;
  uVar8 = n * x;
  if (stride_bytes == 0) {
    stride_bytes = uVar8;
  }
  local_68 = 0xffffffff;
  if (stbi_write_force_png_filter < 5) {
    local_68 = (ulong)(uint)stbi_write_force_png_filter;
  }
  data_len = (uVar8 + 1) * y;
  puVar6 = (uchar *)malloc((long)data_len);
  if (puVar6 != (uchar *)0x0) {
    local_48 = (size_t)(int)uVar8;
    line_buffer = (char *)malloc(local_48);
    if (line_buffer == (char *)0x0) {
      free(puVar6);
    }
    else {
      uVar12 = 0;
      uVar9 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar9 = uVar12;
      }
      local_50 = (long)(int)(uVar8 + 1);
      local_40 = 0;
      uVar7 = local_68;
      local_60 = out_len;
      local_58 = puVar6;
      if (0 < y) {
        local_40 = (ulong)(uint)y;
      }
      for (; uVar12 != local_40; uVar12 = uVar12 + 1) {
        y_00 = (int)uVar12;
        if ((int)uVar7 < 0) {
          iVar11 = 0x7fffffff;
          filter_type = 0;
          for (filter_type_00 = 0; puVar6 = local_58, uVar7 = local_68, filter_type_00 != 5;
              filter_type_00 = filter_type_00 + 1) {
            stbiw__encode_png_line(pixels,stride_bytes,x,y,y_00,n,filter_type_00,line_buffer);
            iVar5 = 0;
            for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
              bVar10 = line_buffer[uVar7] >> 7;
              iVar5 = iVar5 + (uint)(byte)((line_buffer[uVar7] ^ bVar10) - bVar10);
            }
            if (iVar5 < iVar11) {
              iVar11 = iVar5;
              filter_type = filter_type_00;
            }
          }
          uVar4 = '\x05';
          if (filter_type != 5) {
            stbiw__encode_png_line(pixels,stride_bytes,x,y,y_00,n,filter_type,line_buffer);
            uVar4 = (uchar)filter_type;
          }
        }
        else {
          stbiw__encode_png_line(pixels,stride_bytes,x,y,y_00,n,(int)uVar7,line_buffer);
          uVar4 = (uchar)iVar1;
        }
        puVar6[uVar12 * local_50] = uVar4;
        memcpy(puVar6 + uVar12 * local_50 + 1,line_buffer,local_48);
      }
      free(line_buffer);
      __src = stbi_zlib_compress(puVar6,data_len,&zlen,stbi_write_png_compression_level);
      free(puVar6);
      if (__src != (uchar *)0x0) {
        __n = (size_t)zlen;
        puVar6 = (uchar *)malloc(__n + 0x39);
        piVar2 = local_60;
        if (puVar6 != (uchar *)0x0) {
          *local_60 = (int)(__n + 0x39);
          puVar6[0] = 0x89;
          puVar6[1] = 'P';
          puVar6[2] = 'N';
          puVar6[3] = 'G';
          puVar6[4] = '\r';
          puVar6[5] = '\n';
          puVar6[6] = '\x1a';
          puVar6[7] = '\n';
          puVar6[8] = '\0';
          puVar6[9] = '\0';
          puVar6[10] = '\0';
          puVar6[0xb] = '\r';
          puVar6[0xc] = 'I';
          puVar6[0xd] = 'H';
          puVar6[0xe] = 'D';
          puVar6[0xf] = 'R';
          puVar6[0x10] = (uchar)((uint)x >> 0x18);
          puVar6[0x11] = (uchar)((uint)x >> 0x10);
          puVar6[0x12] = (uchar)((uint)x >> 8);
          puVar6[0x13] = (uchar)x;
          puVar6[0x14] = (uchar)((uint)y >> 0x18);
          puVar6[0x15] = (uchar)((uint)y >> 0x10);
          puVar6[0x16] = (uchar)((uint)y >> 8);
          puVar6[0x17] = (uchar)y;
          puVar6[0x18] = '\b';
          puVar6[0x19] = (&DAT_001558c0)[(long)n * 4];
          puVar6[0x1a] = '\0';
          puVar6[0x1b] = '\0';
          local_38 = puVar6 + 0x1d;
          puVar6[0x1c] = '\0';
          stbiw__wpcrc(&local_38,0xd);
          puVar3 = local_38;
          *local_38 = (uchar)((uint)zlen >> 0x18);
          local_38[1] = (uchar)((uint)zlen >> 0x10);
          local_38[2] = (uchar)((uint)zlen >> 8);
          local_38[3] = (uchar)zlen;
          local_38[4] = 'I';
          local_38[5] = 'D';
          local_38[6] = 'A';
          local_38[7] = 'T';
          memmove(local_38 + 8,__src,__n);
          local_38 = puVar3 + __n + 8;
          free(__src);
          stbiw__wpcrc(&local_38,zlen);
          local_38[0] = '\0';
          local_38[1] = '\0';
          local_38[2] = '\0';
          local_38[3] = '\0';
          local_38[4] = 'I';
          local_38[5] = 'E';
          local_38[6] = 'N';
          local_38[7] = 'D';
          local_38 = local_38 + 8;
          stbiw__wpcrc(&local_38,0);
          if (local_38 == puVar6 + *piVar2) {
            return puVar6;
          }
          __assert_fail("o == out + *out_len",
                        "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/stb/stb_image_write.h"
                        ,0x4b9,
                        "unsigned char *stbi_write_png_to_mem(const unsigned char *, int, int, int, int, int *)"
                       );
        }
      }
    }
  }
  return (uchar *)0x0;
}

Assistant:

STBIWDEF unsigned char *stbi_write_png_to_mem(const unsigned char *pixels, int stride_bytes, int x, int y, int n, int *out_len)
{
   int force_filter = stbi_write_force_png_filter;
   int ctype[5] = { -1, 0, 4, 2, 6 };
   unsigned char sig[8] = { 137,80,78,71,13,10,26,10 };
   unsigned char *out,*o, *filt, *zlib;
   signed char *line_buffer;
   int j,zlen;

   if (stride_bytes == 0)
      stride_bytes = x * n;

   if (force_filter >= 5) {
      force_filter = -1;
   }

   filt = (unsigned char *) STBIW_MALLOC((x*n+1) * y); if (!filt) return 0;
   line_buffer = (signed char *) STBIW_MALLOC(x * n); if (!line_buffer) { STBIW_FREE(filt); return 0; }
   for (j=0; j < y; ++j) {
      int filter_type;
      if (force_filter > -1) {
         filter_type = force_filter;
         stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, force_filter, line_buffer);
      } else { // Estimate the best filter by running through all of them:
         int best_filter = 0, best_filter_val = 0x7fffffff, est, i;
         for (filter_type = 0; filter_type < 5; filter_type++) {
            stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, filter_type, line_buffer);

            // Estimate the entropy of the line using this filter; the less, the better.
            est = 0;
            for (i = 0; i < x*n; ++i) {
               est += abs((signed char) line_buffer[i]);
            }
            if (est < best_filter_val) {
               best_filter_val = est;
               best_filter = filter_type;
            }
         }
         if (filter_type != best_filter) {  // If the last iteration already got us the best filter, don't redo it
            stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, best_filter, line_buffer);
            filter_type = best_filter;
         }
      }
      // when we get here, filter_type contains the filter type, and line_buffer contains the data
      filt[j*(x*n+1)] = (unsigned char) filter_type;
      STBIW_MEMMOVE(filt+j*(x*n+1)+1, line_buffer, x*n);
   }
   STBIW_FREE(line_buffer);
   zlib = stbi_zlib_compress(filt, y*( x*n+1), &zlen, stbi_write_png_compression_level);
   STBIW_FREE(filt);
   if (!zlib) return 0;

   // each tag requires 12 bytes of overhead
   out = (unsigned char *) STBIW_MALLOC(8 + 12+13 + 12+zlen + 12);
   if (!out) return 0;
   *out_len = 8 + 12+13 + 12+zlen + 12;

   o=out;
   STBIW_MEMMOVE(o,sig,8); o+= 8;
   stbiw__wp32(o, 13); // header length
   stbiw__wptag(o, "IHDR");
   stbiw__wp32(o, x);
   stbiw__wp32(o, y);
   *o++ = 8;
   *o++ = STBIW_UCHAR(ctype[n]);
   *o++ = 0;
   *o++ = 0;
   *o++ = 0;
   stbiw__wpcrc(&o,13);

   stbiw__wp32(o, zlen);
   stbiw__wptag(o, "IDAT");
   STBIW_MEMMOVE(o, zlib, zlen);
   o += zlen;
   STBIW_FREE(zlib);
   stbiw__wpcrc(&o, zlen);

   stbiw__wp32(o,0);
   stbiw__wptag(o, "IEND");
   stbiw__wpcrc(&o,0);

   STBIW_ASSERT(o == out + *out_len);

   return out;
}